

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ising_polynomial_sa_system.hpp
# Opt level: O3

void __thiscall
openjij::test::System_IsingPolynomialSystemExplicitLinearPoly_Test::TestBody
          (System_IsingPolynomialSystemExplicitLinearPoly_Test *this)

{
  void *pvVar1;
  undefined8 uVar2;
  long lVar3;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *p_Var4;
  __node_base_ptr *pp_Var5;
  char *pcVar6;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_00;
  initializer_list<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
  __l_01;
  initializer_list<double> __l_02;
  initializer_list<signed_char> __l_03;
  SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  sa_system;
  vector<double,_std::allocator<double>_> value_list;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  key_list;
  IPM bpm;
  undefined1 local_1b0 [8];
  AssertHelper local_1a8;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  pointer local_190;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_168;
  undefined7 uStack_167;
  undefined4 local_160;
  undefined4 uStack_15c;
  double *local_158;
  long local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_138;
  undefined1 local_118;
  vector<double,_std::allocator<double>_> local_110;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_f8;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  local_e0;
  undefined1 local_c8 [32];
  _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_70;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_58 [2];
  
  local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
  local_a8._M_buckets._0_1_ = '\0';
  local_a8._M_bucket_count._0_4_ = 1;
  local_a8._M_rehash_policy._M_next_resize._0_1_ = 0;
  local_a8._M_single_bucket._0_4_ = 2;
  local_58[0].
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)local_c8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)&local_110,__l,(allocator_type *)local_1b0);
  local_188._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_168 = 0;
  local_160 = 1;
  local_140 = 0;
  local_138._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_118 = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_188;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector(&local_f8,__l_00,(allocator_type *)local_1a0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_110;
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::vector(&local_e0,__l_01,(allocator_type *)&local_1a8);
  lVar3 = 0x18;
  do {
    std::
    vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)((long)&local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = -0x78;
  p_Var4 = &local_138;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(&p_Var4->_M_first + 8)]._M_data)
              ((anon_class_1_0_00000001 *)local_1a0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var4->_M_first);
    *(__index_type *)(&p_Var4->_M_first + 8) = 0xff;
    p_Var4 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)((long)p_Var4 + -0x28);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  lVar3 = -0x78;
  pp_Var5 = &local_a8._M_single_bucket;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(pp_Var5 + 4)]._M_data)
              ((anon_class_1_0_00000001 *)&local_188,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)pp_Var5);
    *(__index_type *)(pp_Var5 + 4) = 0xff;
    pp_Var5 = pp_Var5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_c8._0_8_ = 0x4000000000000000;
  local_c8._8_8_ = 0x4000000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_c8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_110,__l_02,(allocator_type *)&local_188._M_first);
  graph::IsingPolynomialModel<double>::IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_c8,&local_e0,&local_110);
  openjij::system::
  SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::SASystem((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)&local_188._M_first,(ModelType *)local_c8,1);
  local_1b0._0_3_ = 0x10101;
  __l_03._M_len = 3;
  __l_03._M_array = local_1b0;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_1a0,__l_03,
             (allocator_type *)&local_1a8);
  openjij::system::
  SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::SetSample((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
               *)&local_188._M_first,(vector<signed_char,_std::allocator<signed_char>_> *)local_1a0)
  ;
  pvVar1 = (void *)CONCAT71(local_1a0._1_7_,local_1a0[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_190 - (long)pvVar1);
  }
  local_1b0._0_4_ = local_188._M_first._M_storage;
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"sa_system.GetSystemSize()","3",(int *)local_1b0,
             (int *)&local_1a8);
  if (local_1a0[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
               ,0xab,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1b0 + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  local_1b0 = (undefined1  [8])(CONCAT71(uStack_167,local_168) - local_188._24_8_);
  local_1a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a0,"sa_system.ExtractSample().size()","3",(unsigned_long *)local_1b0
             ,(int *)&local_1a8);
  if (local_1a0[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
               ,0xac,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1b0 + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  if ((char *)CONCAT71(uStack_167,local_168) == (char *)local_188._24_8_) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_1b0._0_4_ = 1;
    testing::internal::CmpHelperEQ<signed_char,int>
              ((internal *)local_1a0,"sa_system.ExtractSample().at(0)","1",(char *)local_188._24_8_,
               (int *)local_1b0);
    if (local_1a0[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_1b0);
      if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_198->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                 ,0xad,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if (local_1b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1b0 + 8))();
      }
    }
    if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198,local_198);
    }
    if (1 < (ulong)(CONCAT71(uStack_167,local_168) - local_188._24_8_)) {
      local_1b0._0_4_ = 1;
      testing::internal::CmpHelperEQ<signed_char,int>
                ((internal *)local_1a0,"sa_system.ExtractSample().at(1)","1",
                 (char *)(local_188._24_8_ + 1),(int *)local_1b0);
      if (local_1a0[0] == (allocator_type)0x0) {
        testing::Message::Message((Message *)local_1b0);
        if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = (local_198->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                   ,0xae,pcVar6);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_1b0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1b0 + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      if (2 < (ulong)(CONCAT71(uStack_167,local_168) - local_188._24_8_)) {
        local_1b0._0_4_ = 1;
        testing::internal::CmpHelperEQ<signed_char,int>
                  ((internal *)local_1a0,"sa_system.ExtractSample().at(2)","1",
                   (char *)(local_188._24_8_ + 2),(int *)local_1b0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xaf,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb0,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","-8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb1,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb2,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb3,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,0);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb5,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","+8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb6,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb7,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xb8,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,0);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xba,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","-8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xbb,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xbc,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xbd,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,1);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xbf,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","+8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc0,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc1,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc2,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,1);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc4,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","-8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc5,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc6,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,199,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,2);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xc9,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","+8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xca,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xcb,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","+8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xcc,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        openjij::system::
        SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ::Flip((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                *)&local_188._M_first,2);
        local_1b0 = (undefined1  [8])(local_150 - (long)local_158 >> 3);
        local_1a8.data_._0_4_ = 3;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_1a0,"sa_system.GetBaseEnergyDifference().size()","3",
                   (unsigned_long *)local_1b0,(int *)&local_1a8);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xce,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(0)","-8.0",
                   (double)(*(char *)local_188._24_8_ * -2) * *local_158,-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xcf,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )local_1b0 !=
              (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(1)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 1) * -2) * local_158[1],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xd0,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_1a0,"sa_system.GetEnergyDifference(2)","-8.0",
                   (double)(*(char *)(local_188._24_8_ + 2) * -2) * local_158[2],-8.0);
        if (local_1a0[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)local_1b0);
          if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar6 = "";
          }
          else {
            pcVar6 = (local_198->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/system/ising_polynomial_sa_system.hpp"
                     ,0xd1,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_1b0 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1b0 + 8))();
          }
        }
        if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,local_198);
        }
        pvVar1 = (void *)CONCAT71(uStack_13f,local_140);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,local_138._8_8_ - (long)pvVar1);
        }
        if (local_158 != (double *)0x0) {
          operator_delete(local_158,local_148 - (long)local_158);
        }
        if ((char *)local_188._24_8_ != (char *)0x0) {
          operator_delete((void *)local_188._24_8_,CONCAT44(uStack_15c,local_160) - local_188._24_8_
                         );
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(local_58);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ::~vector(&local_70);
        std::
        _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_a8);
        std::
        vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)(local_c8 + 8));
        if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
        ::~vector(&local_e0);
        return;
      }
      goto LAB_0012cd0d;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0012cd0d:
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  if (local_1b0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_1b0 + 8))();
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  openjij::system::
  SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::~SASystem((SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
               *)&local_188._M_first);
  graph::IsingPolynomialModel<double>::~IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_c8);
  if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::~vector(&local_e0);
  _Unwind_Resume(uVar2);
}

Assistant:

TEST(System, IsingPolynomialSystemExplicitLinearPoly) {
   using IPM = graph::IsingPolynomialModel<double>;
         
   std::vector<std::vector<typename IPM::IndexType>> key_list = {
      {0, 1, 2},
      {0, 1, 2}
   };
      
   std::vector<double> value_list = {
      +2.0,
      +2.0
   };
   
   const auto bpm = IPM{key_list, value_list};
   auto sa_system = system::SASystem<IPM, std::mt19937>{bpm, 1};
   
   sa_system.SetSample({+1, +1, +1});
   EXPECT_EQ(sa_system.GetSystemSize(), 3);
   EXPECT_EQ(sa_system.ExtractSample().size(), 3);
   EXPECT_EQ(sa_system.ExtractSample().at(0), 1);
   EXPECT_EQ(sa_system.ExtractSample().at(1), 1);
   EXPECT_EQ(sa_system.ExtractSample().at(2), 1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -8.0);
   sa_system.Flip(0);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), +8.0);
   sa_system.Flip(0);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -8.0);
   sa_system.Flip(1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), +8.0);
   sa_system.Flip(1);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -8.0);
   sa_system.Flip(2);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), +8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), +8.0);
   sa_system.Flip(2);
   EXPECT_EQ(sa_system.GetBaseEnergyDifference().size(), 3);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(0), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(1), -8.0);
   EXPECT_DOUBLE_EQ(sa_system.GetEnergyDifference(2), -8.0);
}